

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectbundle * Curl_conncache_find_bundle(Curl_easy *data,connectdata *conn,conncache *connc)

{
  size_t key_len;
  char local_a8 [8];
  char key [128];
  connectbundle *bundle;
  conncache *connc_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  key[0x78] = '\0';
  key[0x79] = '\0';
  key[0x7a] = '\0';
  key[0x7b] = '\0';
  key[0x7c] = '\0';
  key[0x7d] = '\0';
  key[0x7e] = '\0';
  key[0x7f] = '\0';
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  if (connc != (conncache *)0x0) {
    hashkey(conn,local_a8,0x80);
    key_len = strlen(local_a8);
    key._120_8_ = Curl_hash_pick(&connc->hash,local_a8,key_len);
  }
  return (connectbundle *)key._120_8_;
}

Assistant:

struct connectbundle *
Curl_conncache_find_bundle(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  CONNCACHE_LOCK(data);
  if(connc) {
    char key[HASHKEY_SIZE];
    hashkey(conn, key, sizeof(key));
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}